

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O2

void __thiscall
duckdb::GeoParquetFileMetadata::FlushColumnMeta
          (GeoParquetFileMetadata *this,string *column_name,GeoParquetColumnMetadata *meta)

{
  mapped_type *pmVar1;
  
  ::std::mutex::lock(&this->write_lock);
  pmVar1 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->geometry_columns,column_name);
  ::std::
  _Rb_tree<duckdb::WKBGeometryType,duckdb::WKBGeometryType,std::_Identity<duckdb::WKBGeometryType>,std::less<duckdb::WKBGeometryType>,std::allocator<duckdb::WKBGeometryType>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<duckdb::WKBGeometryType>>
            ((_Rb_tree<duckdb::WKBGeometryType,duckdb::WKBGeometryType,std::_Identity<duckdb::WKBGeometryType>,std::less<duckdb::WKBGeometryType>,std::allocator<duckdb::WKBGeometryType>>
              *)&pmVar1->geometry_types,
             (meta->geometry_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<duckdb::WKBGeometryType>)
             &(meta->geometry_types)._M_t._M_impl.super__Rb_tree_header);
  GeometryBounds::Combine(&pmVar1->bbox,&meta->bbox);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void GeoParquetFileMetadata::FlushColumnMeta(const string &column_name, const GeoParquetColumnMetadata &meta) {
	// Lock the metadata
	lock_guard<mutex> glock(write_lock);

	auto &column = geometry_columns[column_name];

	// Combine the metadata
	column.geometry_types.insert(meta.geometry_types.begin(), meta.geometry_types.end());
	column.bbox.Combine(meta.bbox);
}